

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O1

Parser * xLearn::ObjectCreator_xLearn_parser_registryCSVParser(void)

{
  Parser *pPVar1;
  
  pPVar1 = (Parser *)operator_new(0x30);
  (pPVar1->splitor_)._M_dataplus._M_p = (pointer)&(pPVar1->splitor_).field_2;
  (pPVar1->splitor_)._M_string_length = 0;
  (pPVar1->splitor_).field_2._M_local_buf[0] = '\0';
  pPVar1->_vptr_Parser = (_func_int **)&PTR__Parser_00176430;
  return pPVar1;
}

Assistant:

uint64 Parser::get_line_from_buffer(char* line,
                                    char* buf,
                                    uint64 pos,
                                    uint64 size) {
  if (pos >= size) { return 0; }
  uint64 end_pos = pos;
  while (end_pos < size && buf[end_pos] != '\n') { end_pos++; }
  uint64 read_size = end_pos - pos + 1;
  if (read_size > kMaxLineSize) {
    LOG(FATAL) << "Encountered a too-long line.    \
                   Please check the data.";
  }
  memcpy(line, buf+pos, read_size);
  line[read_size - 1] = '\0';
  if (read_size > 1 && line[read_size - 2] == '\r') {
    // Handle some txt format in windows or DOS.
    line[read_size - 2] = '\0';
  }
  return read_size;
}